

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O2

size_t sp_seg(converter_desc *converter,ucs4_t **inbuf,size_t *inbuf_left,ucs4_t **outbuf,
             size_t *outbuf_left,size_t length)

{
  opencc_conversion_mode oVar1;
  ucs4_t *puVar2;
  size_t *psVar3;
  ucs4_t *puVar4;
  ucs4_t **ppuVar5;
  size_t sVar6;
  size_t sVar7;
  size_t *psVar8;
  size_t sVar9;
  ulong uVar10;
  ucs4_t *puVar11;
  long lVar12;
  ucs4_t *result;
  size_t sVar13;
  size_t sVar14;
  bool bVar15;
  size_t match_len;
  converter_desc *local_48;
  size_t local_40;
  ulong local_38;
  
  if (length != 1) {
    if (((converter->spseg_buffer).initialized == 0) ||
       ((converter->spseg_buffer).buffer_size < length + 1)) {
      sp_seg_set_buffer_size(&converter->spseg_buffer,length + 1);
    }
    psVar8 = (converter->spseg_buffer).min_len;
    for (sVar6 = 0xffffffffffffffff; length != sVar6; sVar6 = sVar6 + 1) {
      psVar8[sVar6 + 1] = 0x7fffffff;
    }
    *(converter->spseg_buffer).parent = 0;
    *psVar8 = 0;
    sVar6 = 0;
    while (sVar9 = sVar6, sVar9 != length) {
      sVar7 = dictionary_group_get_all_match_lengths
                        (converter->current_dictionary_group,*inbuf + sVar9,
                         (converter->spseg_buffer).match_length);
      psVar8 = (converter->spseg_buffer).match_length;
      if (*psVar8 != 1) {
        psVar8[sVar7] = 1;
        sVar7 = sVar7 + 1;
      }
      sVar6 = sVar9 + 1;
      for (sVar13 = 0; sVar7 != sVar13; sVar13 = sVar13 + 1) {
        uVar10 = psVar8[sVar13];
        psVar8[sVar13] = 0;
        if (uVar10 < 2) {
          if (uVar10 == 1) {
            psVar3 = (converter->spseg_buffer).min_len;
            if (psVar3[sVar9] + 1 < psVar3[sVar6]) {
              psVar3[sVar6] = psVar3[sVar9] + 1;
              sVar14 = sVar6;
              goto LAB_00103aef;
            }
          }
        }
        else {
          psVar3 = (converter->spseg_buffer).min_len;
          sVar14 = uVar10 + sVar9;
          if (psVar3[sVar9] + 1 <= psVar3[sVar14]) {
            psVar3[sVar14] = psVar3[sVar9] + 1;
LAB_00103aef:
            (converter->spseg_buffer).parent[sVar14] = sVar9;
          }
        }
      }
    }
    psVar8 = (converter->spseg_buffer).min_len;
    lVar12 = psVar8[length] * 8;
    for (sVar6 = length; lVar12 = lVar12 + -8, sVar6 != 0;
        sVar6 = (converter->spseg_buffer).parent[sVar6]) {
      *(size_t *)((long)(converter->spseg_buffer).path + lVar12) = sVar6;
    }
    sVar6 = *inbuf_left;
    local_38 = 0;
    local_40 = 0;
    local_48 = converter;
    do {
      if (psVar8[length] <= local_38) {
        sVar9 = *inbuf_left;
LAB_00103d41:
        return sVar6 - sVar9;
      }
      sVar9 = (converter->spseg_buffer).path[local_38];
      sVar7 = sVar9 - local_40;
      local_40 = sVar9;
      ppuVar5 = dictionary_group_match_longest
                          (converter->current_dictionary_group,*inbuf,sVar7,&match_len);
      if (ppuVar5 == (ucs4_t **)0x0) {
        puVar11 = *outbuf;
        *puVar11 = **inbuf;
        *outbuf = puVar11 + 1;
        *outbuf_left = *outbuf_left - 1;
        *inbuf = *inbuf + 1;
        *inbuf_left = *inbuf_left - 1;
      }
      else {
        oVar1 = converter->conversion_mode;
        if (oVar1 == OPENCC_CONVERSION_FAST) {
          puVar11 = *ppuVar5;
          sVar9 = ucs4len(puVar11);
          uVar10 = *outbuf_left;
          if (uVar10 < sVar9) {
            sVar9 = *inbuf_left;
            if (sVar6 == sVar9) {
              errnum = CONVERTER_ERROR_OUTBUF;
              return 0xffffffffffffffff;
            }
            goto LAB_00103d41;
          }
          while( true ) {
            uVar10 = uVar10 - 1;
            if (*puVar11 == 0) break;
            puVar2 = *outbuf;
            *puVar2 = *puVar11;
            *outbuf = puVar2 + 1;
            *outbuf_left = uVar10;
            puVar11 = puVar11 + 1;
          }
          *inbuf = *inbuf + match_len;
          *inbuf_left = *inbuf_left - match_len;
        }
        else if (oVar1 == OPENCC_CONVERSION_SEGMENT_ONLY) {
          sVar9 = match_len;
          if (*outbuf_left < match_len + 1) {
            sVar9 = *inbuf_left;
            if (sVar6 == sVar9) {
              errnum = CONVERTER_ERROR_OUTBUF;
              return 0xffffffffffffffff;
            }
            goto LAB_00103d41;
          }
          while (bVar15 = sVar9 != 0, sVar9 = sVar9 - 1, bVar15) {
            puVar11 = *outbuf;
            *puVar11 = **inbuf;
            *outbuf = puVar11 + 1;
            *outbuf_left = *outbuf_left - 1;
            *inbuf = *inbuf + 1;
            *inbuf_left = *inbuf_left - 1;
          }
          puVar11 = *outbuf;
          *puVar11 = 0x20;
          *outbuf = puVar11 + 1;
          *outbuf_left = *outbuf_left - 1;
        }
        else {
          if (oVar1 != OPENCC_CONVERSION_LIST_CANDIDATES) {
            fprintf(_stderr,"Should not be here %s: %d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/converter.c"
                    ,0x174);
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/converter.c"
                          ,0x174,
                          "size_t sp_seg(converter_desc *, ucs4_t **, size_t *, ucs4_t **, size_t *, size_t)"
                         );
          }
          lVar12 = 0;
          while (puVar11 = ppuVar5[lVar12], puVar11 != (ucs4_t *)0x0) {
            puVar2 = ppuVar5[lVar12 + 1];
            sVar9 = ucs4len(puVar11);
            uVar10 = *outbuf_left;
            converter = local_48;
            if (uVar10 < (sVar9 + 1) - (ulong)(puVar2 == (ucs4_t *)0x0)) {
              sVar9 = *inbuf_left;
              if (sVar6 == sVar9) {
                errnum = CONVERTER_ERROR_OUTBUF;
                return 0xffffffffffffffff;
              }
              goto LAB_00103d00;
            }
            lVar12 = lVar12 + 1;
            while( true ) {
              uVar10 = uVar10 - 1;
              if (*puVar11 == 0) break;
              puVar4 = *outbuf;
              *puVar4 = *puVar11;
              *outbuf = puVar4 + 1;
              *outbuf_left = uVar10;
              puVar11 = puVar11 + 1;
            }
            if (puVar2 != (ucs4_t *)0x0) {
              puVar11 = *outbuf;
              *puVar11 = 0x20;
              *outbuf = puVar11 + 1;
              *outbuf_left = uVar10;
            }
          }
          sVar9 = *inbuf_left;
LAB_00103d00:
          *inbuf = *inbuf + match_len;
          *inbuf_left = sVar9 - match_len;
        }
      }
      local_38 = local_38 + 1;
      psVar8 = (converter->spseg_buffer).min_len;
    } while( true );
  }
  ppuVar5 = dictionary_group_match_longest
                      (converter->current_dictionary_group,*inbuf,1,(size_t *)0x0);
  oVar1 = converter->conversion_mode;
  if (oVar1 == OPENCC_CONVERSION_LIST_CANDIDATES) {
    if (ppuVar5 != (ucs4_t **)0x0) {
      lVar12 = 0;
      while (puVar11 = ppuVar5[lVar12], puVar11 != (ucs4_t *)0x0) {
        puVar2 = ppuVar5[lVar12 + 1];
        sVar6 = ucs4len(puVar11);
        uVar10 = *outbuf_left;
        if (uVar10 < (sVar6 + 1) - (ulong)(puVar2 == (ucs4_t *)0x0)) {
          errnum = CONVERTER_ERROR_OUTBUF;
          return 0xffffffffffffffff;
        }
        lVar12 = lVar12 + 1;
        while( true ) {
          uVar10 = uVar10 - 1;
          if (*puVar11 == 0) break;
          puVar4 = *outbuf;
          *puVar4 = *puVar11;
          *outbuf = puVar4 + 1;
          *outbuf_left = uVar10;
          puVar11 = puVar11 + 1;
        }
        if (puVar2 != (ucs4_t *)0x0) {
          puVar11 = *outbuf;
          *puVar11 = 0x20;
          *outbuf = puVar11 + 1;
          *outbuf_left = uVar10;
        }
      }
      *inbuf = *inbuf + 1;
      goto LAB_00103e8c;
    }
  }
  else {
    if (oVar1 == OPENCC_CONVERSION_SEGMENT_ONLY) {
      if (ppuVar5 == (ucs4_t **)0x0) {
        puVar11 = *outbuf;
        *puVar11 = **inbuf;
        *outbuf = puVar11 + 1;
        uVar10 = *outbuf_left;
      }
      else {
        uVar10 = *outbuf_left;
        if (uVar10 < 2) {
          errnum = CONVERTER_ERROR_OUTBUF;
          return 0xffffffffffffffff;
        }
        puVar11 = *outbuf;
        *puVar11 = **inbuf;
        *outbuf = puVar11 + 1;
      }
      *outbuf_left = uVar10 - 1;
      *inbuf = *inbuf + 1;
      *inbuf_left = *inbuf_left - 1;
      puVar11 = *outbuf;
      *puVar11 = 0x20;
      *outbuf = puVar11 + 1;
      *outbuf_left = *outbuf_left - 1;
      return 1;
    }
    if (oVar1 != OPENCC_CONVERSION_FAST) {
      fprintf(_stderr,"Should not be here %s: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/converter.c"
              ,0xc0);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/converter.c"
                    ,0xc0,
                    "size_t sp_seg(converter_desc *, ucs4_t **, size_t *, ucs4_t **, size_t *, size_t)"
                   );
    }
    if (ppuVar5 != (ucs4_t **)0x0) {
      puVar11 = *ppuVar5;
      sVar6 = ucs4len(puVar11);
      uVar10 = *outbuf_left;
      if (uVar10 < sVar6) {
        errnum = CONVERTER_ERROR_OUTBUF;
        return 0xffffffffffffffff;
      }
      while( true ) {
        uVar10 = uVar10 - 1;
        if (*puVar11 == 0) break;
        puVar2 = *outbuf;
        *puVar2 = *puVar11;
        *outbuf = puVar2 + 1;
        *outbuf_left = uVar10;
        puVar11 = puVar11 + 1;
      }
      *inbuf = *inbuf + 1;
      goto LAB_00103e8c;
    }
  }
  puVar11 = *outbuf;
  *puVar11 = **inbuf;
  *outbuf = puVar11 + 1;
  *outbuf_left = *outbuf_left - 1;
  *inbuf = *inbuf + 1;
LAB_00103e8c:
  *inbuf_left = *inbuf_left - 1;
  return 1;
}

Assistant:

static size_t sp_seg(converter_desc * converter, ucs4_t ** inbuf, size_t * inbuf_left,
		ucs4_t ** outbuf, size_t * outbuf_left, size_t length)
{
	/* 最短路徑分詞 */
	
	/* 對長度爲1時特殊優化 */
	if (length == 1)
	{
		const ucs4_t * const * match_rs = dictionary_group_match_longest(
				converter->current_dictionary_group,
				*inbuf,
				1,
				NULL
		);
		
		size_t match_len = 1;
		if (converter->conversion_mode == OPENCC_CONVERSION_FAST)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				const ucs4_t * result = match_rs[0];

				/* 輸出緩衝區剩餘空間小於分詞長度 */
				if (ucs4len(result) > *outbuf_left)
				{
					errnum = CONVERTER_ERROR_OUTBUF;
					return (size_t) -1;
				}

				for (; *result; result ++)
				{
					**outbuf = *result;
					(*outbuf) ++,(*outbuf_left) --;
				}

				*inbuf += match_len;
				*inbuf_left -= match_len;
			}
		}
		else if (converter->conversion_mode == OPENCC_CONVERSION_LIST_CANDIDATES)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				size_t i;
				for (i = 0; match_rs[i] != NULL; i ++)
				{
					const ucs4_t * result = match_rs[i];
					int show_delimiter = match_rs[i + 1] != NULL ? 1 : 0;

					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (ucs4len(result) + show_delimiter > *outbuf_left)
					{
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					for (; *result; result ++)
					{
						**outbuf = *result;
						(*outbuf) ++,(*outbuf_left) --;
					}

					if (show_delimiter)
					{
						**outbuf = DELIMITER;
						(*outbuf) ++, (*outbuf_left) --;
					}
				}
				*inbuf += match_len;
				*inbuf_left -= match_len;
			}
		}
		else if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				/* 輸出緩衝區剩餘空間小於分詞長度 */
				if (match_len + 1 > *outbuf_left)
				{
					errnum = CONVERTER_ERROR_OUTBUF;
					return (size_t) -1;
				}

				size_t i;
				for (i = 0; i < match_len; i ++)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
			}
			**outbuf = DELIMITER;
			(*outbuf) ++, (*outbuf_left) --;
		}
		else
			debug_should_not_be_here();
		/* 必須保證有一個字符空間 */
		return match_len;
	}
	
	/* 設置緩衝區空間 */
	spseg_buffer_desc * ossb = &(converter->spseg_buffer);
	size_t buffer_size_need = length + 1;
	if (ossb->initialized == FALSE || ossb->buffer_size < buffer_size_need)
		sp_seg_set_buffer_size(&(converter->spseg_buffer), buffer_size_need);
	
	size_t i, j;

	for (i = 0; i <= length; i ++)
		ossb->min_len[i] = INFINITY_INT;
	
	ossb->min_len[0] = ossb->parent[0] = 0;
	
	for (i = 0; i < length; i ++)
	{
		/* 獲取所有匹配長度 */
		size_t match_count = dictionary_group_get_all_match_lengths(
				converter->current_dictionary_group,
				(*inbuf) + i,
				ossb->match_length
		);
		
		if (ossb->match_length[0] != 1)
			ossb->match_length[match_count ++] = 1;
		
		/* 動態規劃求最短分割路徑 */
		for (j = 0; j < match_count; j ++)
		{
			size_t k = ossb->match_length[j];
			ossb->match_length[j] = 0;
			
			if (k > 1 && ossb->min_len[i] + 1 <= ossb->min_len[i + k])
			{
				ossb->min_len[i + k] = ossb->min_len[i] + 1;
				ossb->parent[i + k] = i;
			}
			else if (k == 1 && ossb->min_len[i] + 1 < ossb->min_len[i + k])
			{
				ossb->min_len[i + k] = ossb->min_len[i] + 1;
				ossb->parent[i + k] = i;
			}
		}
	}
	
	/* 取得最短分割路徑 */
	for (i = length, j = ossb->min_len[length]; i != 0; i = ossb->parent[i])
		ossb->path[--j] = i;
	
	size_t inbuf_left_start = *inbuf_left;
	size_t begin, end;

	/* 根據最短分割路徑轉換 */
	for (i = begin = 0; i < ossb->min_len[length]; i ++)
	{
		end = ossb->path[i];
		
		size_t match_len;
		const ucs4_t * const * match_rs = dictionary_group_match_longest(
				converter->current_dictionary_group,
				*inbuf,
				end - begin,
				&match_len
		);

		if (match_rs == NULL)
		{
			**outbuf = **inbuf;
			(*outbuf) ++, (*outbuf_left) --;
			(*inbuf) ++, (*inbuf_left) --;
		}
		else
		{
			if (converter->conversion_mode == OPENCC_CONVERSION_FAST)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					const ucs4_t * result = match_rs[0];

					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (ucs4len(result) > *outbuf_left)
					{
						if (inbuf_left_start - *inbuf_left > 0)
							break;
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					for (; *result; result ++)
					{
						**outbuf = *result;
						(*outbuf) ++,(*outbuf_left) --;
					}

					*inbuf += match_len;
					*inbuf_left -= match_len;
				}
			}
			else if (converter->conversion_mode == OPENCC_CONVERSION_LIST_CANDIDATES)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					size_t i;
					for (i = 0; match_rs[i] != NULL; i ++)
					{
						const ucs4_t * result = match_rs[i];
						int show_delimiter = match_rs[i + 1] != NULL ? 1 : 0;

						/* 輸出緩衝區剩餘空間小於分詞長度 */
						if (ucs4len(result) + show_delimiter > *outbuf_left)
						{
							if (inbuf_left_start - *inbuf_left > 0)
								break;
							errnum = CONVERTER_ERROR_OUTBUF;
							return (size_t) -1;
						}

						for (; *result; result ++)
						{
							**outbuf = *result;
							(*outbuf) ++,(*outbuf_left) --;
						}

						if (show_delimiter)
						{
							**outbuf = DELIMITER;
							(*outbuf) ++, (*outbuf_left) --;
						}
					}
					*inbuf += match_len;
					*inbuf_left -= match_len;
				}
			}
			else if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (match_len + 1 > *outbuf_left)
					{
						if (inbuf_left_start - *inbuf_left > 0)
							break;
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					size_t i;
					for (i = 0; i < match_len; i ++)
					{
						**outbuf = **inbuf;
						(*outbuf) ++, (*outbuf_left) --;
						(*inbuf) ++, (*inbuf_left) --;
					}
				}
				**outbuf = DELIMITER;
				(*outbuf) ++, (*outbuf_left) --;
			}
			else
				debug_should_not_be_here();
		}
		
		begin = end;
	}
	
	return inbuf_left_start - *inbuf_left;
}